

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

void half_to_float_buffer(float *out,uint16_t *in,int w)

{
  float *out_00;
  uint16_t *src;
  float *out_01;
  uint16_t *src_00;
  float fVar1;
  
  out_01 = out + 4;
  src_00 = in + 4;
  while( true ) {
    out_00 = out_01 + -4;
    src = src_00 + -4;
    if (w < 8) break;
    half_to_float4(out_00,src);
    half_to_float4(out_01,src_00);
    w = w + -8;
    out_01 = out_01 + 8;
    src_00 = src_00 + 8;
  }
  switch(w) {
  case 1:
    fVar1 = half_to_float(*src);
    *out_00 = fVar1;
    break;
  case 2:
    fVar1 = half_to_float(src_00[-4]);
    out_01[-4] = fVar1;
    fVar1 = half_to_float(src_00[-3]);
    out_01[-3] = fVar1;
    break;
  case 3:
    fVar1 = half_to_float(src_00[-4]);
    out_01[-4] = fVar1;
    fVar1 = half_to_float(src_00[-3]);
    out_01[-3] = fVar1;
    fVar1 = half_to_float(src_00[-2]);
    out_01[-2] = fVar1;
    break;
  case 4:
    half_to_float4(out_00,src);
    return;
  case 5:
    half_to_float4(out_00,src);
    fVar1 = half_to_float(*src_00);
    *out_01 = fVar1;
    break;
  case 6:
    half_to_float4(out_00,src);
    fVar1 = half_to_float(*src_00);
    *out_01 = fVar1;
    fVar1 = half_to_float(src_00[1]);
    out_01[1] = fVar1;
    break;
  case 7:
    half_to_float4(out_00,src);
    fVar1 = half_to_float(*src_00);
    *out_01 = fVar1;
    fVar1 = half_to_float(src_00[1]);
    out_01[1] = fVar1;
    fVar1 = half_to_float(src_00[2]);
    out_01[2] = fVar1;
  }
  return;
}

Assistant:

static inline void
half_to_float_buffer (float* out, const uint16_t* in, int w)
{
#    if EXR_HOST_IS_NOT_LITTLE_ENDIAN
    for (int x = 0; x < w; ++x)
        out[x] = half_to_float (one_to_native16 (in[x]));
#    else
    while (w >= 8)
    {
        half_to_float8 (out, in);
        out += 8;
        in += 8;
        w -= 8;
    }
    switch (w)
    {
        case 7:
            half_to_float4 (out, in);
            out[4] = half_to_float (in[4]);
            out[5] = half_to_float (in[5]);
            out[6] = half_to_float (in[6]);
            break;
        case 6:
            half_to_float4 (out, in);
            out[4] = half_to_float (in[4]);
            out[5] = half_to_float (in[5]);
            break;
        case 5:
            half_to_float4 (out, in);
            out[4] = half_to_float (in[4]);
            break;
        case 4: half_to_float4 (out, in); break;
        case 3:
            out[0] = half_to_float (in[0]);
            out[1] = half_to_float (in[1]);
            out[2] = half_to_float (in[2]);
            break;
        case 2:
            out[0] = half_to_float (in[0]);
            out[1] = half_to_float (in[1]);
            break;
        case 1: out[0] = half_to_float (in[0]); break;
    }
#    endif
}